

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetCompileDefinitionsCommand.cxx
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_693c3c::TargetCompileDefinitionsImpl::HandleDirectContent
          (TargetCompileDefinitionsImpl *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool param_3,bool param_4)

{
  undefined1 local_a8 [40];
  string local_80;
  allocator<char> local_49;
  string local_48;
  undefined1 local_22;
  undefined1 local_21;
  bool param_4_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_20;
  bool param_3_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *content_local;
  cmTarget *tgt_local;
  TargetCompileDefinitionsImpl *this_local;
  
  local_22 = param_4;
  local_21 = param_3;
  pvStack_20 = content;
  content_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)tgt;
  tgt_local = (cmTarget *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"COMPILE_DEFINITIONS",&local_49);
  (*(this->super_cmTargetPropCommandBase)._vptr_cmTargetPropCommandBase[6])
            (&local_80,this,pvStack_20);
  cmMakefile::GetBacktrace((cmMakefile *)local_a8);
  std::optional<cmListFileBacktrace>::optional<cmListFileBacktrace,_true>
            ((optional<cmListFileBacktrace> *)(local_a8 + 0x10),(cmListFileBacktrace *)local_a8);
  cmTarget::AppendProperty
            (tgt,&local_48,&local_80,(optional<cmListFileBacktrace> *)(local_a8 + 0x10),false);
  std::optional<cmListFileBacktrace>::~optional((optional<cmListFileBacktrace> *)(local_a8 + 0x10));
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_a8);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  return true;
}

Assistant:

bool HandleDirectContent(cmTarget* tgt,
                           const std::vector<std::string>& content,
                           bool /*prepend*/, bool /*system*/) override
  {
    tgt->AppendProperty("COMPILE_DEFINITIONS", this->Join(content),
                        this->Makefile->GetBacktrace());
    return true; // Successfully handled.
  }